

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setStrikeOut(QFont *this,bool enable)

{
  byte *pbVar1;
  QFontPrivate *pQVar2;
  
  if (((this->resolve_mask & 0x100) == 0) || (((((this->d).d.ptr)->field_0x7c & 4) == 0) == enable))
  {
    QFontPrivate::detachButKeepEngineData(this);
    pQVar2 = (this->d).d.ptr;
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0xfb | enable << 2;
    pbVar1 = (byte *)((long)&this->resolve_mask + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

void QFont::setStrikeOut(bool enable)
{
    if ((resolve_mask & QFont::StrikeOutResolved) && d->strikeOut == enable)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->strikeOut = enable;
    resolve_mask |= QFont::StrikeOutResolved;
}